

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_cleanup(OSQPWorkspace *work)

{
  long *in_RDI;
  c_int exitflag;
  linsys_solver_type in_stack_ffffffffffffffec;
  c_int local_10;
  
  local_10 = 0;
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      if (*(long *)(*in_RDI + 0x10) != 0) {
        csc_spfree((csc *)0x104f7d);
      }
      if (*(long *)(*in_RDI + 0x18) != 0) {
        csc_spfree((csc *)0x104f9d);
      }
      if (*(long *)(*in_RDI + 0x20) != 0) {
        free(*(void **)(*in_RDI + 0x20));
      }
      if (*(long *)(*in_RDI + 0x28) != 0) {
        free(*(void **)(*in_RDI + 0x28));
      }
      if (*(long *)(*in_RDI + 0x30) != 0) {
        free(*(void **)(*in_RDI + 0x30));
      }
      free((void *)*in_RDI);
    }
    if (in_RDI[0x18] != 0) {
      if (*(long *)(in_RDI[0x18] + 8) != 0) {
        free(*(void **)(in_RDI[0x18] + 8));
      }
      if (*(long *)(in_RDI[0x18] + 0x20) != 0) {
        free(*(void **)(in_RDI[0x18] + 0x20));
      }
      if (*(long *)(in_RDI[0x18] + 0x10) != 0) {
        free(*(void **)(in_RDI[0x18] + 0x10));
      }
      if (*(long *)(in_RDI[0x18] + 0x28) != 0) {
        free(*(void **)(in_RDI[0x18] + 0x28));
      }
      free((void *)in_RDI[0x18]);
    }
    if (in_RDI[0x14] != 0) {
      free((void *)in_RDI[0x14]);
    }
    if (in_RDI[0x15] != 0) {
      free((void *)in_RDI[0x15]);
    }
    if (in_RDI[0x16] != 0) {
      free((void *)in_RDI[0x16]);
    }
    if ((in_RDI[1] != 0) && (*(long *)(in_RDI[1] + 0x10) != 0)) {
      (**(code **)(in_RDI[1] + 0x10))(in_RDI[1]);
    }
    if (in_RDI[0x17] != 0) {
      local_10 = unload_linsys_solver(in_stack_ffffffffffffffec);
    }
    if (in_RDI[2] != 0) {
      if (*(long *)(in_RDI[2] + 0x28) != 0) {
        free(*(void **)(in_RDI[2] + 0x28));
      }
      if (*(long *)(in_RDI[2] + 0x30) != 0) {
        free(*(void **)(in_RDI[2] + 0x30));
      }
      if (*(long *)(in_RDI[2] + 0x18) != 0) {
        free(*(void **)(in_RDI[2] + 0x18));
      }
      if (*(long *)(in_RDI[2] + 0x20) != 0) {
        free(*(void **)(in_RDI[2] + 0x20));
      }
      if (*(long *)(in_RDI[2] + 0x38) != 0) {
        free(*(void **)(in_RDI[2] + 0x38));
      }
      if (*(long *)(in_RDI[2] + 0x40) != 0) {
        free(*(void **)(in_RDI[2] + 0x40));
      }
      if (*(long *)(in_RDI[2] + 0x48) != 0) {
        free(*(void **)(in_RDI[2] + 0x48));
      }
      free((void *)in_RDI[2]);
    }
    if (in_RDI[3] != 0) {
      free((void *)in_RDI[3]);
    }
    if (in_RDI[4] != 0) {
      free((void *)in_RDI[4]);
    }
    if (in_RDI[5] != 0) {
      free((void *)in_RDI[5]);
    }
    if (in_RDI[6] != 0) {
      free((void *)in_RDI[6]);
    }
    if (in_RDI[8] != 0) {
      free((void *)in_RDI[8]);
    }
    if (in_RDI[9] != 0) {
      free((void *)in_RDI[9]);
    }
    if (in_RDI[10] != 0) {
      free((void *)in_RDI[10]);
    }
    if (in_RDI[0xb] != 0) {
      free((void *)in_RDI[0xb]);
    }
    if (in_RDI[7] != 0) {
      free((void *)in_RDI[7]);
    }
    if (in_RDI[0xc] != 0) {
      free((void *)in_RDI[0xc]);
    }
    if (in_RDI[0xd] != 0) {
      free((void *)in_RDI[0xd]);
    }
    if (in_RDI[0xe] != 0) {
      free((void *)in_RDI[0xe]);
    }
    if (in_RDI[0xf] != 0) {
      free((void *)in_RDI[0xf]);
    }
    if (in_RDI[0x10] != 0) {
      free((void *)in_RDI[0x10]);
    }
    if (in_RDI[0x11] != 0) {
      free((void *)in_RDI[0x11]);
    }
    if (in_RDI[0x12] != 0) {
      free((void *)in_RDI[0x12]);
    }
    if (in_RDI[0x13] != 0) {
      free((void *)in_RDI[0x13]);
    }
    if (in_RDI[0x17] != 0) {
      free((void *)in_RDI[0x17]);
    }
    if (in_RDI[0x19] != 0) {
      if (*(long *)in_RDI[0x19] != 0) {
        free(*(void **)in_RDI[0x19]);
      }
      if (*(long *)(in_RDI[0x19] + 8) != 0) {
        free(*(void **)(in_RDI[0x19] + 8));
      }
      free((void *)in_RDI[0x19]);
    }
    if (in_RDI[0x1a] != 0) {
      free((void *)in_RDI[0x1a]);
    }
    if (in_RDI[0x1b] != 0) {
      free((void *)in_RDI[0x1b]);
    }
    free(in_RDI);
  }
  return local_10;
}

Assistant:

c_int osqp_cleanup(OSQPWorkspace *work) {
  c_int exitflag = 0;

  if (work) { // If workspace has been allocated
    // Free Data
    if (work->data) {
      if (work->data->P) csc_spfree(work->data->P);
      if (work->data->A) csc_spfree(work->data->A);
      if (work->data->q) c_free(work->data->q);
      if (work->data->l) c_free(work->data->l);
      if (work->data->u) c_free(work->data->u);
      c_free(work->data);
    }

    // Free scaling variables
    if (work->scaling){
      if (work->scaling->D)    c_free(work->scaling->D);
      if (work->scaling->Dinv) c_free(work->scaling->Dinv);
      if (work->scaling->E)    c_free(work->scaling->E);
      if (work->scaling->Einv) c_free(work->scaling->Einv);
      c_free(work->scaling);
    }

    // Free temp workspace variables for scaling
    if (work->D_temp)   c_free(work->D_temp);
    if (work->D_temp_A) c_free(work->D_temp_A);
    if (work->E_temp)   c_free(work->E_temp);

    // Free linear system solver structure
    if (work->linsys_solver) {
      if (work->linsys_solver->free) {
        work->linsys_solver->free(work->linsys_solver);
      }
    }

    // Unload linear system solver after free
    if (work->settings) {
      exitflag = unload_linsys_solver(work->settings->linsys_solver);
    }

#ifndef EMBEDDED
    // Free active constraints structure
    if (work->pol) {
      if (work->pol->Alow_to_A) c_free(work->pol->Alow_to_A);
      if (work->pol->Aupp_to_A) c_free(work->pol->Aupp_to_A);
      if (work->pol->A_to_Alow) c_free(work->pol->A_to_Alow);
      if (work->pol->A_to_Aupp) c_free(work->pol->A_to_Aupp);
      if (work->pol->x)         c_free(work->pol->x);
      if (work->pol->z)         c_free(work->pol->z);
      if (work->pol->y)         c_free(work->pol->y);
      c_free(work->pol);
    }
#endif /* ifndef EMBEDDED */

    // Free other Variables
    if (work->rho_vec)     c_free(work->rho_vec);
    if (work->rho_inv_vec) c_free(work->rho_inv_vec);
#if EMBEDDED != 1
    if (work->constr_type) c_free(work->constr_type);
#endif
    if (work->x)           c_free(work->x);
    if (work->z)           c_free(work->z);
    if (work->xz_tilde)    c_free(work->xz_tilde);
    if (work->x_prev)      c_free(work->x_prev);
    if (work->z_prev)      c_free(work->z_prev);
    if (work->y)           c_free(work->y);
    if (work->Ax)          c_free(work->Ax);
    if (work->Px)          c_free(work->Px);
    if (work->Aty)         c_free(work->Aty);
    if (work->delta_y)     c_free(work->delta_y);
    if (work->Atdelta_y)   c_free(work->Atdelta_y);
    if (work->delta_x)     c_free(work->delta_x);
    if (work->Pdelta_x)    c_free(work->Pdelta_x);
    if (work->Adelta_x)    c_free(work->Adelta_x);

    // Free Settings
    if (work->settings) c_free(work->settings);

    // Free solution
    if (work->solution) {
      if (work->solution->x) c_free(work->solution->x);
      if (work->solution->y) c_free(work->solution->y);
      c_free(work->solution);
    }

    // Free information
    if (work->info) c_free(work->info);

# ifdef PROFILING
    // Free timer
    if (work->timer) c_free(work->timer);
# endif /* ifdef PROFILING */

    // Free work
    c_free(work);
  }

  return exitflag;
}